

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomShaderProgram.cpp
# Opt level: O2

void __thiscall
deqp::gls::RandomShaderProgram::shadeFragments
          (RandomShaderProgram *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  ExecutionContext *this_00;
  deUint32 dVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  Shader *this_01;
  pointer ppSVar5;
  Variable *variable;
  GenericVec4 *pGVar6;
  float fVar7;
  float fVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  int packetNdx;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  bool bVar19;
  StridedValueAccess<64> SVar20;
  ConstStridedValueAccess<64> CVar21;
  Vec4 varValue;
  ExecValueAccess access;
  ConstStridedValueAccess<64> local_40;
  
  this_00 = &this->m_execCtx;
  local_40 = (ConstStridedValueAccess<64>)
             rsg::ExecutionContext::getValue(this_00,this->m_fragColorVar);
  for (iVar9 = 0; uVar12 = numPackets - iVar9, uVar12 != 0 && iVar9 <= numPackets;
      iVar9 = uVar12 + iVar9) {
    if (0xf < (int)uVar12) {
      uVar12 = 0x10;
    }
    uVar10 = 0;
    if (0 < (int)uVar12) {
      uVar10 = (ulong)uVar12;
    }
    lVar16 = 0;
    while( true ) {
      this_01 = this->m_fragmentShader;
      ppSVar5 = (this_01->m_inputs).
                super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((int)((ulong)((long)(this_01->m_inputs).
                              super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar5) >> 3) <=
          lVar16) break;
      variable = ppSVar5[lVar16]->m_variable;
      uVar14 = (variable->m_type).m_numElements;
      access = rsg::ExecutionContext::getValue(this_00,variable);
      lVar18 = 0;
      for (uVar11 = 0; uVar11 != uVar10; uVar11 = uVar11 + 1) {
        iVar15 = 0;
        lVar13 = 4;
        lVar17 = lVar18;
        while (bVar19 = lVar13 != 0, lVar13 = lVar13 + -1, bVar19) {
          rr::readVarying<float>
                    ((rr *)&varValue,packets + ((int)uVar11 + iVar9),context,(int)lVar16,iVar15);
          fVar7 = varValue.m_data[0];
          SVar20 = rsg::StridedValueAccess<64>::component(&access,0);
          fVar8 = varValue.m_data[1];
          *(float *)((long)SVar20.super_ConstStridedValueAccess<64>.m_value + lVar17) = fVar7;
          if (1 < (int)uVar14) {
            SVar20 = rsg::StridedValueAccess<64>::component(&access,1);
            fVar7 = varValue.m_data[2];
            *(float *)((long)SVar20.super_ConstStridedValueAccess<64>.m_value + lVar17) = fVar8;
            if (uVar14 != 2) {
              SVar20 = rsg::StridedValueAccess<64>::component(&access,2);
              fVar8 = varValue.m_data[3];
              *(float *)((long)SVar20.super_ConstStridedValueAccess<64>.m_value + lVar17) = fVar7;
              if (3 < uVar14) {
                SVar20 = rsg::StridedValueAccess<64>::component(&access,3);
                *(float *)((long)SVar20.super_ConstStridedValueAccess<64>.m_value + lVar17) = fVar8;
              }
            }
          }
          lVar17 = lVar17 + 4;
          iVar15 = iVar15 + 1;
        }
        lVar18 = lVar18 + 0x10;
      }
      lVar16 = lVar16 + 1;
    }
    rsg::Shader::execute(this_01,this_00);
    lVar16 = 0;
    uVar11 = 0;
    while( true ) {
      if (uVar11 == uVar10) break;
      uVar14 = 0;
      lVar18 = 4;
      lVar13 = lVar16;
      while (bVar19 = lVar18 != 0, lVar18 = lVar18 + -1, bVar19) {
        CVar21 = rsg::ConstStridedValueAccess<64>::component(&local_40,0);
        dVar1 = *(deUint32 *)((long)CVar21.m_value + lVar13);
        CVar21 = rsg::ConstStridedValueAccess<64>::component(&local_40,1);
        dVar2 = *(deUint32 *)((long)CVar21.m_value + lVar13);
        CVar21 = rsg::ConstStridedValueAccess<64>::component(&local_40,2);
        dVar3 = *(deUint32 *)((long)CVar21.m_value + lVar13);
        CVar21 = rsg::ConstStridedValueAccess<64>::component(&local_40,3);
        dVar4 = *(deUint32 *)((long)CVar21.m_value + lVar13);
        pGVar6 = context->outputArray;
        iVar15 = ((iVar9 + (int)uVar11) * 4 | uVar14) * context->numFragmentOutputs;
        pGVar6[iVar15].v.uData[0] = dVar1;
        pGVar6[iVar15].v.uData[1] = dVar2;
        pGVar6[iVar15].v.uData[2] = dVar3;
        pGVar6[iVar15].v.uData[3] = dVar4;
        uVar14 = uVar14 + 1;
        lVar13 = lVar13 + 4;
      }
      uVar11 = uVar11 + 1;
      lVar16 = lVar16 + 0x10;
    }
  }
  return;
}

Assistant:

void RandomShaderProgram::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const rsg::ExecConstValueAccess	fragColorAccess	= m_execCtx.getValue(m_fragColorVar);
	int								packetOffset	= 0;

	DE_STATIC_ASSERT(rsg::EXEC_VEC_WIDTH % rr::NUM_FRAGMENTS_PER_PACKET == 0);

	while (packetOffset < numPackets)
	{
		const int	numPacketsToExecute	= de::min(numPackets-packetOffset, (int)rsg::EXEC_VEC_WIDTH / (int)rr::NUM_FRAGMENTS_PER_PACKET);

		// Interpolate varyings.
		for (int varNdx = 0; varNdx < (int)m_fragmentShader.getInputs().size(); ++varNdx)
		{
			const rsg::Variable*		var				= m_fragmentShader.getInputs()[varNdx]->getVariable();
			const rsg::VariableType&	varType			= var->getType();
			const int					numComponents	= varType.getNumElements();
			rsg::ExecValueAccess		access			= m_execCtx.getValue(var);

			DE_ASSERT(varType.isFloatOrVec() && de::inRange(numComponents, 1, 4));

			for (int packetNdx = 0; packetNdx < numPacketsToExecute; packetNdx++)
			{
				const rr::FragmentPacket&	packet		= packets[packetOffset+packetNdx];

				for (int fragNdx = 0; fragNdx < rr::NUM_FRAGMENTS_PER_PACKET; fragNdx++)
				{
					const tcu::Vec4		varValue	= rr::readVarying<float>(packet, context, varNdx, fragNdx);
					const int			dstNdx		= packetNdx*rr::NUM_FRAGMENTS_PER_PACKET + fragNdx;

											access.component(0).asFloat(dstNdx) = varValue[0];
					if (numComponents >= 2)	access.component(1).asFloat(dstNdx) = varValue[1];
					if (numComponents >= 3)	access.component(2).asFloat(dstNdx) = varValue[2];
					if (numComponents >= 4)	access.component(3).asFloat(dstNdx) = varValue[3];
				}
			}
		}

		m_fragmentShader.execute(m_execCtx);

		// Store color
		for (int packetNdx = 0; packetNdx < numPacketsToExecute; packetNdx++)
		{
			for (int fragNdx = 0; fragNdx < rr::NUM_FRAGMENTS_PER_PACKET; fragNdx++)
			{
				const int		srcNdx	= packetNdx*rr::NUM_FRAGMENTS_PER_PACKET + fragNdx;
				const tcu::Vec4 color	(fragColorAccess.component(0).asFloat(srcNdx),
										 fragColorAccess.component(1).asFloat(srcNdx),
										 fragColorAccess.component(2).asFloat(srcNdx),
										 fragColorAccess.component(3).asFloat(srcNdx));

				rr::writeFragmentOutput(context, packetOffset+packetNdx, fragNdx, 0, color);
			}
		}

		packetOffset += numPacketsToExecute;
	}
}